

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O3

void __thiscall vpl::Scope::SpawnFunctionScope(Scope *this)

{
  pointer pFVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer name;
  
  std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::emplace_back<>(&this->scopes_);
  pFVar1 = (this->functions_).super__Vector_base<vpl::Function,_std::allocator<vpl::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = pFVar1[-1].args_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (name = pFVar1[-1].args_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; name != pbVar2; name = name + 1) {
    NameScope::AddVariable
              ((this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1,name);
  }
  return;
}

Assistant:

void SpawnFunctionScope() {
        OpenScope();
        for (const auto& arg : functions_.back().GetArgs()) {
            scopes_.back().AddVariable(arg);
        }
    }